

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void rtDataHandler(vector<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_> *rtData)

{
  ostream *poVar1;
  float *pfVar2;
  int j;
  int index;
  ulong uVar3;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rtDataHandler::i);
  std::operator<<(poVar1,"] RT Data is ->  ");
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(rtData->
                            super__Vector_base<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(rtData->
                            super__Vector_base<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    for (index = 0; index != 6; index = index + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Ch ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,index);
      poVar1 = std::operator<<(poVar1,": ");
      pfVar2 = SRI::RTData<float>::operator[]
                         ((rtData->
                          super__Vector_base<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar3,index);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pfVar2);
      std::operator<<(poVar1,"\t");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  rtDataHandler::i = rtDataHandler::i + 1;
  return;
}

Assistant:

void rtDataHandler(std::vector<RTData<float>>& rtData) {
    static int i = 0;
    std::cout << "[" << i << "] RT Data is ->  ";
    for(int i = 0; i < rtData.size(); i++) {
        for(int j = 0; j < 6; j++) {
            std::cout << "Ch " << j << ": " << rtData[i][j] << "\t";
        }
        std::cout << std::endl;
    }
    i++;
}